

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::MultiThreadRenderCase::executeForContexts
          (MultiThreadRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_> *this_00;
  allocator<de::SharedPtr<de::Semaphore>_> *this_01;
  allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp> *this_02;
  allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>
  *this_03;
  EGLContext context_00;
  bool bVar1;
  EGLint EVar2;
  EGLint height_00;
  int a;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  deBool dVar6;
  Library *egl_00;
  size_type sVar7;
  TestLog *this_04;
  char *str;
  MessageBuilder *pMVar8;
  reference this_05;
  reference drawOp_00;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  const_reference pvVar12;
  Program *pPVar13;
  reference pvVar14;
  RenderTestThread *pRVar15;
  reference pvVar16;
  Semaphore *pSVar17;
  undefined1 local_cc0 [7];
  bool imagesOk;
  int local_c94;
  void *pvStack_c90;
  int threadNdx_2;
  EGLContext context_2;
  undefined1 local_c80 [4];
  EGLint api_2;
  int local_c6c;
  void *pvStack_c68;
  int threadNdx_1;
  EGLContext context_1;
  undefined1 local_c58 [4];
  EGLint api_1;
  void *local_c48;
  EGLContext context;
  EGLint api;
  int ctxNdx;
  DrawOpPacket *packet;
  int packetNdx;
  int threadNdx;
  __normal_iterator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
  local_c20;
  iterator drawOp;
  __normal_iterator<de::SharedPtr<de::Semaphore>_*,_std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>_>
  local_c08;
  __normal_iterator<de::SharedPtr<de::Semaphore>_*,_std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>_>
  local_c00;
  iterator sem;
  MessageBuilder local_a78;
  MessageBuilder local_8f8;
  MessageBuilder local_778;
  MessageBuilder local_5f8;
  MessageBuilder local_478;
  MessageBuilder local_2f8;
  allocator<de::SharedPtr<deqp::egl::RenderTestThread>_> local_171;
  undefined1 local_170 [8];
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  threads;
  undefined1 local_150 [8];
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  packets;
  undefined1 local_130 [8];
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  drawOps;
  undefined1 local_110 [8];
  vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_> semaphores;
  undefined1 local_f0 [8];
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  programs;
  Random rnd;
  undefined1 local_b8 [8];
  Surface frame;
  Surface refFrame;
  TestLog *log;
  EGLint local_78;
  int numSamples;
  int stencilBits;
  int depthBits;
  PixelFormat pixelFmt;
  float threshold;
  int numPackets;
  int numThreads;
  int packetsPerThread;
  int opsPerPacket;
  int numContexts;
  int height;
  int width;
  Library *egl;
  vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts_local;
  Config *config_local;
  EGLSurface surface_local;
  EGLDisplay display_local;
  MultiThreadRenderCase *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                      super_TestCase.m_eglTestCtx);
  EVar2 = eglu::querySurfaceInt(egl_00,display,surface,0x3057);
  height_00 = eglu::querySurfaceInt(egl_00,display,surface,0x3056);
  sVar7 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::size
                    (contexts);
  a = (int)sVar7;
  pixelFmt.alphaBits = a * 2;
  pixelFmt.blueBits = 0x3ca3d70a;
  _stencilBits = anon_unknown_4::getPixelFormat(egl_00,display,config->config);
  numSamples = eglu::getConfigAttribInt(egl_00,display,config->config,0x3025);
  local_78 = eglu::getConfigAttribInt(egl_00,display,config->config,0x3026);
  log._4_4_ = eglu::getConfigAttribInt(egl_00,display,config->config,0x3031);
  this_04 = tcu::TestContext::getLog
                      ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                       super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::Surface::Surface((Surface *)&frame.m_pixels.m_cap,EVar2,height_00);
  tcu::Surface::Surface((Surface *)local_b8,EVar2,height_00);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  dVar4 = ::deInt32Hash(a);
  de::Random::Random((Random *)
                     ((long)&programs.
                             super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),dVar3 ^ dVar4);
  this_00 = (allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_> *)
            ((long)&semaphores.
                    super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>::allocator(this_00);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::vector((vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
            *)local_f0,(long)a,this_00);
  std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>::~allocator
            ((allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_> *)
             ((long)&semaphores.
                     super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar5 = pixelFmt.alphaBits + 1;
  this_01 = (allocator<de::SharedPtr<de::Semaphore>_> *)
            ((long)&drawOps.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<de::SharedPtr<de::Semaphore>_>::allocator(this_01);
  std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::vector
            ((vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_> *
             )local_110,(long)iVar5,this_01);
  std::allocator<de::SharedPtr<de::Semaphore>_>::~allocator
            ((allocator<de::SharedPtr<de::Semaphore>_> *)
             ((long)&drawOps.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar5 = pixelFmt.alphaBits * 2;
  this_02 = (allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp> *)
            ((long)&packets.
                    super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>::allocator(this_02);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
            *)local_130,(long)iVar5,this_02);
  std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>::~allocator
            ((allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp> *)
             ((long)&packets.
                     super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this_03 = (allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>
             *)((long)&threads.
                       super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>::
  allocator(this_03);
  std::
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  ::vector((vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
            *)local_150,(long)a,this_03);
  std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>::
  ~allocator((allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>
              *)((long)&threads.
                        super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>::allocator(&local_171);
  std::
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  ::vector((vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
            *)local_170,(long)a,&local_171);
  std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>::~allocator(&local_171);
  tcu::TestLog::operator<<(&local_2f8,this_04,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_2f8,(char (*) [16])"EGL_RED_SIZE = ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&stencilBits);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2f8);
  tcu::TestLog::operator<<(&local_478,this_04,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_478,(char (*) [18])"EGL_GREEN_SIZE = ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&depthBits);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_478);
  tcu::TestLog::operator<<(&local_5f8,this_04,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_5f8,(char (*) [17])"EGL_BLUE_SIZE = ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pixelFmt.redBits);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5f8);
  tcu::TestLog::operator<<(&local_778,this_04,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_778,(char (*) [18])"EGL_ALPHA_SIZE = ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pixelFmt.greenBits);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_778);
  tcu::TestLog::operator<<(&local_8f8,this_04,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_8f8,(char (*) [18])"EGL_DEPTH_SIZE = ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&numSamples);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8f8);
  tcu::TestLog::operator<<(&local_a78,this_04,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_a78,(char (*) [20])"EGL_STENCIL_SIZE = ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_78);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a78);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&sem,this_04,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)&sem,(char (*) [15])"EGL_SAMPLES = ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&log + 4));
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&sem);
  local_c00._M_current =
       (SharedPtr<de::Semaphore> *)
       std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::
       begin((vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_> *
             )local_110);
  while( true ) {
    local_c08._M_current =
         (SharedPtr<de::Semaphore> *)
         std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::
         end((vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_> *
             )local_110);
    bVar1 = __gnu_cxx::operator!=(&local_c00,&local_c08);
    if (!bVar1) break;
    pSVar17 = (Semaphore *)operator_new(8);
    de::Semaphore::Semaphore(pSVar17,0,0);
    de::SharedPtr<de::Semaphore>::SharedPtr((SharedPtr<de::Semaphore> *)&drawOp,pSVar17);
    this_05 = __gnu_cxx::
              __normal_iterator<de::SharedPtr<de::Semaphore>_*,_std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>_>
              ::operator*(&local_c00);
    de::SharedPtr<de::Semaphore>::operator=(this_05,(SharedPtr<de::Semaphore> *)&drawOp);
    de::SharedPtr<de::Semaphore>::~SharedPtr((SharedPtr<de::Semaphore> *)&drawOp);
    __gnu_cxx::
    __normal_iterator<de::SharedPtr<de::Semaphore>_*,_std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>_>
    ::operator++(&local_c00);
  }
  local_c20._M_current =
       (DrawPrimitiveOp *)
       std::
       vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
       ::begin((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                *)local_130);
  while( true ) {
    _packetNdx = std::
                 vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                 ::end((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                        *)local_130);
    bVar1 = __gnu_cxx::operator!=
                      (&local_c20,
                       (__normal_iterator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
                        *)&packetNdx);
    if (!bVar1) break;
    drawOp_00 = __gnu_cxx::
                __normal_iterator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
                ::operator*(&local_c20);
    anon_unknown_4::randomizeDrawOp
              ((Random *)
               ((long)&programs.
                       super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),drawOp_00);
    __gnu_cxx::
    __normal_iterator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
    ::operator++(&local_c20);
  }
  for (packet._4_4_ = 0; packet._4_4_ < a; packet._4_4_ = packet._4_4_ + 1) {
    pvVar9 = std::
             vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
             ::operator[]((vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                           *)local_150,(long)packet._4_4_);
    std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>::resize(pvVar9,2)
    ;
    for (packet._0_4_ = 0; (int)packet < 2; packet._0_4_ = (int)packet + 1) {
      pvVar9 = std::
               vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
               ::operator[]((vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                             *)local_150,(long)packet._4_4_);
      _api = std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>::
             operator[](pvVar9,(long)(int)packet);
      pvVar10 = std::
                vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                ::operator[]((vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                              *)local_110,(long)((int)packet * a + packet._4_4_));
      de::SharedPtr<de::Semaphore>::operator=(&_api->wait,pvVar10);
      pvVar10 = std::
                vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                ::operator[]((vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                              *)local_110,(long)((int)packet * a + 1 + packet._4_4_));
      de::SharedPtr<de::Semaphore>::operator=(&_api->signal,pvVar10);
      _api->numOps = 2;
      pvVar11 = std::
                vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                ::operator[]((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                              *)local_130,(long)(((int)packet * a + packet._4_4_) * 2));
      _api->drawOps = pvVar11;
    }
  }
  for (context._4_4_ = 0; context._4_4_ < a; context._4_4_ = context._4_4_ + 1) {
    pvVar12 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
              operator[](contexts,(long)context._4_4_);
    context._0_4_ = pvVar12->first;
    pvVar12 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
              operator[](contexts,(long)context._4_4_);
    local_c48 = pvVar12->second;
    do {
      (*egl_00->_vptr_Library[0x27])(egl_00,display,surface,surface,local_c48);
      dVar3 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar3,"makeCurrent(display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x3c6);
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
    pPVar13 = anon_unknown_4::createProgram(&this->m_gl,(int)context);
    de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::SharedPtr
              ((SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)local_c58,pPVar13);
    pvVar14 = std::
              vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
              ::operator[]((vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                            *)local_f0,(long)context._4_4_);
    de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::operator=
              (pvVar14,(SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)local_c58);
    de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::~SharedPtr
              ((SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)local_c58);
    pvVar14 = std::
              vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
              ::operator[]((vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                            *)local_f0,(long)context._4_4_);
    pPVar13 = de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::operator->(pvVar14);
    (*pPVar13->_vptr_Program[2])();
    do {
      (*egl_00->_vptr_Library[0x27])(egl_00,display,0,0);
      dVar3 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar3,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x3cc);
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
  }
  pvVar12 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
            operator[](contexts,0);
  context_1._4_4_ = pvVar12->first;
  pvVar12 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
            operator[](contexts,0);
  pvStack_c68 = pvVar12->second;
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,display,surface,surface,pvStack_c68);
    dVar3 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"makeCurrent(display, surface, surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x3d4);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  anon_unknown_4::clear(&this->m_gl,context_1._4_4_,(Vec4 *)CLEAR_COLOR,1.0,0);
  anon_unknown_4::finish(&this->m_gl,context_1._4_4_);
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,display,0,0);
    dVar3 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x3da);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  for (local_c6c = 0; local_c6c < a; local_c6c = local_c6c + 1) {
    pRVar15 = (RenderTestThread *)operator_new(0x58);
    pvVar12 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
              operator[](contexts,(long)local_c6c);
    context_00 = pvVar12->second;
    pvVar12 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
              operator[](contexts,(long)local_c6c);
    EVar2 = pvVar12->first;
    pvVar14 = std::
              vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
              ::operator[]((vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                            *)local_f0,(long)local_c6c);
    pPVar13 = de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::operator*(pvVar14);
    pvVar9 = std::
             vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
             ::operator[]((vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                           *)local_150,(long)local_c6c);
    RenderTestThread::RenderTestThread
              (pRVar15,egl_00,display,surface,context_00,EVar2,&this->m_gl,pPVar13,pvVar9);
    de::SharedPtr<deqp::egl::RenderTestThread>::SharedPtr
              ((SharedPtr<deqp::egl::RenderTestThread> *)local_c80,pRVar15);
    pvVar16 = std::
              vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
              ::operator[]((vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                            *)local_170,(long)local_c6c);
    de::SharedPtr<deqp::egl::RenderTestThread>::operator=
              (pvVar16,(SharedPtr<deqp::egl::RenderTestThread> *)local_c80);
    de::SharedPtr<deqp::egl::RenderTestThread>::~SharedPtr
              ((SharedPtr<deqp::egl::RenderTestThread> *)local_c80);
    pvVar16 = std::
              vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
              ::operator[]((vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                            *)local_170,(long)local_c6c);
    pRVar15 = de::SharedPtr<deqp::egl::RenderTestThread>::operator->(pvVar16);
    de::Thread::start(&pRVar15->super_Thread);
  }
  pvVar10 = std::
            vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::
            front((vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                   *)local_110);
  pSVar17 = de::SharedPtr<de::Semaphore>::operator->(pvVar10);
  de::Semaphore::increment(pSVar17);
  pvVar10 = std::
            vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::
            back((vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                  *)local_110);
  pSVar17 = de::SharedPtr<de::Semaphore>::operator->(pvVar10);
  de::Semaphore::decrement(pSVar17);
  pvVar12 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
            operator[](contexts,0);
  context_2._4_4_ = pvVar12->first;
  pvVar12 = std::vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>::
            operator[](contexts,0);
  pvStack_c90 = pvVar12->second;
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,display,surface,surface,pvStack_c90);
    dVar3 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"makeCurrent(display, surface, surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x3ed);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  anon_unknown_4::readPixels(&this->m_gl,context_2._4_4_,(Surface *)local_b8);
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,display,0,0);
    dVar3 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x3f2);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  for (local_c94 = 0; local_c94 < a; local_c94 = local_c94 + 1) {
    pvVar16 = std::
              vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
              ::operator[]((vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                            *)local_170,(long)local_c94);
    pRVar15 = de::SharedPtr<deqp::egl::RenderTestThread>::operator->(pvVar16);
    de::Thread::join(&pRVar15->super_Thread);
  }
  tcu::Surface::getAccess((PixelBufferAccess *)local_cc0,(Surface *)&frame.m_pixels.m_cap);
  anon_unknown_4::renderReference
            ((PixelBufferAccess *)local_cc0,
             (vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
              *)local_130,(PixelFormat *)&stencilBits,numSamples,local_78,1);
  bVar1 = tcu::fuzzyCompare(this_04,"ComparisonResult","Image comparison result",
                            (Surface *)&frame.m_pixels.m_cap,(Surface *)local_b8,0.02,
                            COMPARE_LOG_RESULT);
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  std::
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  ::~vector((vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
             *)local_170);
  std::
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  ::~vector((vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
             *)local_150);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ::~vector((vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
             *)local_130);
  std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::~vector
            ((vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_> *
             )local_110);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::~vector((vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
             *)local_f0);
  de::Random::~Random((Random *)
                      ((long)&programs.
                              super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  tcu::Surface::~Surface((Surface *)local_b8);
  tcu::Surface::~Surface((Surface *)&frame.m_pixels.m_cap);
  return;
}

Assistant:

void MultiThreadRenderCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&			egl					= m_eglTestCtx.getLibrary();
	const int				width				= eglu::querySurfaceInt(egl, display, surface, EGL_WIDTH);
	const int				height				= eglu::querySurfaceInt(egl, display, surface, EGL_HEIGHT);
	const int				numContexts			= (int)contexts.size();
	const int				opsPerPacket		= 2;
	const int				packetsPerThread	= 2;
	const int				numThreads			= numContexts;
	const int				numPackets			= numThreads * packetsPerThread;
	const float				threshold			= 0.02f;

	const tcu::PixelFormat	pixelFmt			= getPixelFormat(egl, display, config.config);
	const int				depthBits			= eglu::getConfigAttribInt(egl, display, config.config, EGL_DEPTH_SIZE);
	const int				stencilBits			= eglu::getConfigAttribInt(egl, display, config.config, EGL_STENCIL_SIZE);
	const int				numSamples			= eglu::getConfigAttribInt(egl, display, config.config, EGL_SAMPLES);

	TestLog&				log					= m_testCtx.getLog();

	tcu::Surface			refFrame			(width, height);
	tcu::Surface			frame				(width, height);

	de::Random				rnd					(deStringHash(getName()) ^ deInt32Hash(numContexts));

	// Resources that need cleanup
	vector<ProgramSp>				programs	(numContexts);
	vector<SemaphoreSp>				semaphores	(numPackets+1);
	vector<DrawPrimitiveOp>			drawOps		(numPackets*opsPerPacket);
	vector<vector<DrawOpPacket> >	packets		(numThreads);
	vector<RenderTestThreadSp>		threads		(numThreads);

	// Log basic information about config.
	log << TestLog::Message << "EGL_RED_SIZE = "		<< pixelFmt.redBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_GREEN_SIZE = "		<< pixelFmt.greenBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_BLUE_SIZE = "		<< pixelFmt.blueBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_ALPHA_SIZE = "		<< pixelFmt.alphaBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_DEPTH_SIZE = "		<< depthBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_STENCIL_SIZE = "	<< stencilBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_SAMPLES = "			<< numSamples << TestLog::EndMessage;

	// Initialize semaphores.
	for (vector<SemaphoreSp>::iterator sem = semaphores.begin(); sem != semaphores.end(); ++sem)
		*sem = SemaphoreSp(new de::Semaphore(0));

	// Create draw ops.
	for (vector<DrawPrimitiveOp>::iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); ++drawOp)
		randomizeDrawOp(rnd, *drawOp);

	// Create packets.
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
	{
		packets[threadNdx].resize(packetsPerThread);

		for (int packetNdx = 0; packetNdx < packetsPerThread; packetNdx++)
		{
			DrawOpPacket& packet = packets[threadNdx][packetNdx];

			// Threads take turns with packets.
			packet.wait		= semaphores[packetNdx*numThreads + threadNdx];
			packet.signal	= semaphores[packetNdx*numThreads + threadNdx + 1];
			packet.numOps	= opsPerPacket;
			packet.drawOps	= &drawOps[(packetNdx*numThreads + threadNdx)*opsPerPacket];
		}
	}

	// Create and setup programs per context
	for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
	{
		EGLint		api			= contexts[ctxNdx].first;
		EGLContext	context		= contexts[ctxNdx].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		programs[ctxNdx] = ProgramSp(createProgram(m_gl, api));
		programs[ctxNdx]->setup();

		// Release context
		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		clear(m_gl, api, CLEAR_COLOR, CLEAR_DEPTH, CLEAR_STENCIL);
		finish(m_gl, api);

		// Release context
		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}

	// Create and launch threads (actual rendering starts once first semaphore is signaled).
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
	{
		threads[threadNdx] = RenderTestThreadSp(new RenderTestThread(egl, display, surface, contexts[threadNdx].second, contexts[threadNdx].first, m_gl, *programs[threadNdx], packets[threadNdx]));
		threads[threadNdx]->start();
	}

	// Signal start and wait until complete.
	semaphores.front()->increment();
	semaphores.back()->decrement();

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		readPixels(m_gl, api, frame);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

	// Join threads.
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
		threads[threadNdx]->join();

	// Render reference.
	renderReference(refFrame.getAccess(), drawOps, pixelFmt, depthBits, stencilBits, 1);

	// Compare images
	{
		bool imagesOk = tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, threshold, tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}